

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::VerifyUTF8
          (EpsCopyInputStream *this,char *ptr,size_t size)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *extraout_RDX;
  string_view str;
  
  iVar2 = BytesAvailable(this,ptr);
  if ((ulong)(long)iVar2 < size) {
    pcVar3 = VerifyUTF8Fallback(this,ptr,size);
    return pcVar3;
  }
  str._M_str = extraout_RDX;
  str._M_len = (size_t)ptr;
  bVar1 = utf8_range::IsStructurallyValid((utf8_range *)size,str);
  pcVar3 = (char *)0x0;
  if (bVar1) {
    pcVar3 = ptr + size;
  }
  return pcVar3;
}

Assistant:

const char* EpsCopyInputStream::VerifyUTF8(const char* ptr, size_t size) {
  if (size <= static_cast<size_t>(BytesAvailable(ptr))) {
    return utf8_range::IsStructurallyValid({ptr, size}) ? ptr + size : nullptr;
  }
  return VerifyUTF8Fallback(ptr, size);
}